

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

subrange __thiscall clipp::parameter::match(parameter *this,arg_string *arg)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  subrange sVar5;
  
  pbVar1 = (this->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    if ((this->matcher_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    sVar5 = (*(this->matcher_)._M_invoker)((_Any_data *)&this->matcher_,arg);
  }
  else if (arg->_M_string_length == 0) {
    sVar5 = (subrange)ZEXT816(0xffffffffffffffff);
  }
  else {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar1,pbVar2,arg);
    if (_Var4._M_current ==
        (this->flags_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sVar5 = str::
              longest_prefix_match<char,std::char_traits<char>,std::allocator<char>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (arg,&this->flags_);
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = arg->_M_string_length;
      sVar5 = (subrange)(auVar3 << 0x40);
    }
  }
  return sVar5;
}

Assistant:

subrange
    match(const arg_string& arg) const
    {
        if(flags_.empty()) {
            return matcher_(arg);
        }
        else {
            //empty flags are not allowed
            if(arg.empty()) return subrange{};

            if(std::find(flags_.begin(), flags_.end(), arg) != flags_.end()) {
                return subrange{0,arg.size()};
            }
            return str::longest_prefix_match(arg, flags_);
        }
    }